

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt_env_infrastructure.cpp
# Opt level: O0

void __thiscall so_5::env_infrastructures::default_mt::impl::coop_repo_t::start(coop_repo_t *this)

{
  mchain_params_t *params;
  type local_80;
  thread local_78 [3];
  mchain_params_t local_60;
  environment_t local_18;
  coop_repo_t *this_local;
  
  local_18.m_impl._M_t.
  super___uniq_ptr_impl<so_5::environment_t::internals_t,_std::default_delete<so_5::environment_t::internals_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::environment_t::internals_t_*,_std::default_delete<so_5::environment_t::internals_t>_>
  .super__Head_base<0UL,_so_5::environment_t::internals_t_*,_false>._M_head_impl =
       (__uniq_ptr_data<so_5::environment_t::internals_t,_std::default_delete<so_5::environment_t::internals_t>,_true,_true>
        )(__uniq_ptr_data<so_5::environment_t::internals_t,_std::default_delete<so_5::environment_t::internals_t>,_true,_true>
          )this;
  params = (mchain_params_t *)
           so_5::impl::coop_repository_basis_t::environment(&this->super_coop_repository_basis_t);
  make_unlimited_mchain_params();
  mchain_params_t::disable_msg_tracing(&local_60);
  environment_t::create_mchain(&local_18,params);
  intrusive_ptr_t<so_5::abstract_message_chain_t>::operator=
            (&this->m_final_dereg_chain,(intrusive_ptr_t<so_5::abstract_message_chain_t> *)&local_18
            );
  intrusive_ptr_t<so_5::abstract_message_chain_t>::~intrusive_ptr_t
            ((intrusive_ptr_t<so_5::abstract_message_chain_t> *)&local_18);
  mchain_params_t::~mchain_params_t(&local_60);
  local_80.this = this;
  std::thread::thread<so_5::env_infrastructures::default_mt::impl::coop_repo_t::start()::__0,,void>
            (local_78,&local_80);
  std::thread::operator=(&this->m_final_dereg_thread,local_78);
  std::thread::~thread(local_78);
  return;
}

Assistant:

void
coop_repo_t::start()
{
	// mchain for final coop deregs must be created.
	m_final_dereg_chain = environment().create_mchain(
			make_unlimited_mchain_params().disable_msg_tracing() );
	// A separate thread for doing the final dereg must be started.
	m_final_dereg_thread = std::thread{ [this] {
		// Process dereg demands until chain will be closed.
		receive( from( m_final_dereg_chain ),
			[]( coop_t * coop ) {
				coop_t::call_final_deregister_coop( coop );
			} );
	} };
}